

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::End(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *g;
  ImGuiWindow *pIVar6;
  char *__function;
  float fVar7;
  
  pIVar4 = GImGui;
  iVar2 = (GImGui->CurrentWindowStack).Size;
  if ((iVar2 < 2) && (GImGui->FrameScopePushedImplicitWindow == true)) {
    __assert_fail("g.CurrentWindowStack.Size > 1 && \"Calling End() too many times!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                  ,0x16c0,"void ImGui::End()");
  }
  if (iVar2 < 1) {
    __assert_fail("g.CurrentWindowStack.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                  ,0x16c3,"void ImGui::End()");
  }
  pIVar6 = GImGui->CurrentWindow;
  if ((pIVar6->DC).CurrentColumns != (ImGuiColumns *)0x0) {
    EndColumns();
  }
  PopClipRect();
  if ((pIVar6->Flags & 0x1000000) == 0) {
    LogFinish();
  }
  iVar2 = (pIVar4->CurrentWindowStack).Size;
  if (0 < iVar2) {
    uVar1 = iVar2 - 1;
    (pIVar4->CurrentWindowStack).Size = uVar1;
    if ((pIVar6->Flags & 0x4000000) != 0) {
      iVar3 = (pIVar4->BeginPopupStack).Size;
      if (iVar3 < 1) {
        __function = "void ImVector<ImGuiPopupData>::pop_back() [T = ImGuiPopupData]";
        goto LAB_00117b8d;
      }
      (pIVar4->BeginPopupStack).Size = iVar3 + -1;
    }
    pIVar5 = GImGui;
    if ((pIVar6->IDStack).Size != (int)(pIVar6->DC).StackSizesBackup[0]) {
      __assert_fail("*p_backup == current && \"PushID/PopID or TreeNode/TreePop Mismatch!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                    ,0x1227,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    if ((pIVar6->DC).GroupStack.Size != (int)(pIVar6->DC).StackSizesBackup[1]) {
      __assert_fail("*p_backup == current && \"BeginGroup/EndGroup Mismatch!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                    ,0x1228,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    if ((GImGui->BeginPopupStack).Size != (int)(pIVar6->DC).StackSizesBackup[2]) {
      __assert_fail("*p_backup == current && \"BeginMenu/EndMenu or BeginPopup/EndPopup Mismatch\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                    ,0x1229,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    if ((GImGui->ColorModifiers).Size <= (int)(pIVar6->DC).StackSizesBackup[3]) {
      if ((int)(pIVar6->DC).StackSizesBackup[4] < (GImGui->StyleModifiers).Size) {
        __assert_fail("*p_backup >= current && \"PushStyleVar/PopStyleVar Mismatch!\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                      ,0x122c,"void CheckStacksSize(ImGuiWindow *, bool)");
      }
      if ((GImGui->FontStack).Size <= (int)(pIVar6->DC).StackSizesBackup[5]) {
        if (uVar1 == 0) {
          pIVar6 = (ImGuiWindow *)0x0;
        }
        else {
          if (iVar2 == 1) {
            __assert_fail("Size > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                          ,0x4f0,"T &ImVector<ImGuiWindow *>::back() [T = ImGuiWindow *]");
          }
          pIVar6 = (pIVar4->CurrentWindowStack).Data[(ulong)uVar1 - 1];
        }
        GImGui->CurrentWindow = pIVar6;
        if (pIVar6 != (ImGuiWindow *)0x0) {
          fVar7 = pIVar5->FontBaseSize * pIVar6->FontWindowScale;
          if (pIVar6->ParentWindow != (ImGuiWindow *)0x0) {
            fVar7 = fVar7 * pIVar6->ParentWindow->FontWindowScale;
          }
          (pIVar5->DrawListSharedData).FontSize = fVar7;
          pIVar5->FontSize = fVar7;
        }
        return;
      }
      __assert_fail("*p_backup >= current && \"PushFont/PopFont Mismatch!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                    ,0x122d,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    __assert_fail("*p_backup >= current && \"PushStyleColor/PopStyleColor Mismatch!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                  ,0x122b,"void CheckStacksSize(ImGuiWindow *, bool)");
  }
  __function = "void ImVector<ImGuiWindow *>::pop_back() [T = ImGuiWindow *]";
LAB_00117b8d:
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                ,0x4fb,__function);
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;

    if (g.CurrentWindowStack.Size <= 1 && g.FrameScopePushedImplicitWindow)
    {
        IM_ASSERT(g.CurrentWindowStack.Size > 1 && "Calling End() too many times!");
        return; // FIXME-ERRORHANDLING
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    ImGuiWindow* window = g.CurrentWindow;

    if (window->DC.CurrentColumns)
        EndColumns();
    PopClipRect();   // Inner window clip rectangle

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Pop from window stack
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    CheckStacksSize(window, false);
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
}